

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDF::readHintStream(QPDF *this,Pipeline *pl,qpdf_offset_t offset,size_t length)

{
  bool bVar1;
  pointer pMVar2;
  QPDFExc *pQVar3;
  qpdf_offset_t qVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar5;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string_view local_150;
  long local_140;
  qpdf_offset_t computed_end;
  mapped_type *local_130;
  ObjCache *oc2;
  string local_120 [32];
  undefined1 local_100 [8];
  QPDFObjectHandle length_obj;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  qpdf_offset_t local_a0;
  qpdf_offset_t max_end_offset;
  qpdf_offset_t min_end_offset;
  ObjCache *oc;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  QPDFObjectHandle H;
  QPDFObjGen og;
  size_t length_local;
  qpdf_offset_t offset_local;
  Pipeline *pl_local;
  QPDF *this_local;
  QPDFObjectHandle *Hdict;
  
  QPDFObjGen::QPDFObjGen
            ((QPDFObjGen *)
             &H.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"linearization hint stream",&local_69)
  ;
  QPDFObjGen::QPDFObjGen((QPDFObjGen *)((long)&oc + 4),0,0);
  readObjectAtOffset((QPDF *)local_48,SUB81(pl,0),0,(string *)length,(QPDFObjGen)local_68,
                     stack0xffffffffffffff7c,(bool)((char)&H + '\b'));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)pl);
  min_end_offset =
       (qpdf_offset_t)
       std::
       map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
       ::operator[](&pMVar2->obj_cache,
                    (key_type *)
                    &H.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  max_end_offset = ((mapped_type *)min_end_offset)->end_before_space;
  local_a0 = ((mapped_type *)min_end_offset)->end_after_space;
  bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_48);
  if (!bVar1) {
    length_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._6_1_ = 1;
    pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"linearization dictionary",&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"hint table is not a stream",
               (allocator<char> *)
               ((long)&length_obj.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    damagedPDF(pQVar3,(QPDF *)pl,&local_c0,&local_e8);
    length_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._6_1_ = 0;
    __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  length_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._5_1_ = 0;
  QPDFObjectHandle::getDict((QPDFObjectHandle *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"/Length",(allocator<char> *)((long)&oc2 + 7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_100,(string *)this);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&oc2 + 7));
  bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_100);
  if (bVar1) {
    QTC::TC("qpdf","QPDF hint table length indirect",0);
    QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_100);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)pl);
    computed_end = (qpdf_offset_t)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_100);
    local_130 = std::
                map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                ::operator[](&pMVar2->obj_cache,(key_type *)&computed_end);
    max_end_offset = local_130->end_before_space;
    local_a0 = local_130->end_after_space;
  }
  else {
    QTC::TC("qpdf","QPDF hint table length direct",0);
  }
  qVar4 = toO<unsigned_long>((unsigned_long *)&og);
  local_140 = length + qVar4;
  if ((max_end_offset <= local_140) && (local_140 <= local_a0)) {
    QPDFObjectHandle::pipeStreamData
              ((QPDFObjectHandle *)local_48,(Pipeline *)offset,0,qpdf_dl_specialized,false,false);
    length_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._5_1_ = 1;
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_100);
    if ((length_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._5_1_ & 1) == 0) {
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)this);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
    QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (QPDFObjectHandle)
           QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__cxx11::to_string(&local_210,local_140);
  std::operator+(&local_1f0,"expected = ",&local_210);
  std::operator+(&local_1d0,&local_1f0,"; actual = ");
  std::__cxx11::to_string(&local_230,max_end_offset);
  std::operator+(&local_1b0,&local_1d0,&local_230);
  std::operator+(&local_190,&local_1b0,"..");
  std::__cxx11::to_string(&local_250,local_a0);
  std::operator+(&local_170,&local_190,&local_250);
  local_150 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_170);
  linearizationWarning((QPDF *)pl,local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"linearization dictionary",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"hint table length mismatch",&local_299);
  damagedPDF(pQVar3,(QPDF *)pl,&local_270,&local_298);
  __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

QPDFObjectHandle
QPDF::readHintStream(Pipeline& pl, qpdf_offset_t offset, size_t length)
{
    QPDFObjGen og;
    QPDFObjectHandle H =
        readObjectAtOffset(false, offset, "linearization hint stream", QPDFObjGen(0, 0), og, false);
    ObjCache& oc = m->obj_cache[og];
    qpdf_offset_t min_end_offset = oc.end_before_space;
    qpdf_offset_t max_end_offset = oc.end_after_space;
    if (!H.isStream()) {
        throw damagedPDF("linearization dictionary", "hint table is not a stream");
    }

    QPDFObjectHandle Hdict = H.getDict();

    // Some versions of Acrobat make /Length indirect and place it immediately after the stream,
    // increasing length to cover it, even though the specification says all objects in the
    // linearization parameter dictionary must be direct.  We have to get the file position of the
    // end of length in this case.
    QPDFObjectHandle length_obj = Hdict.getKey("/Length");
    if (length_obj.isIndirect()) {
        QTC::TC("qpdf", "QPDF hint table length indirect");
        // Force resolution
        (void)length_obj.getIntValue();
        ObjCache& oc2 = m->obj_cache[length_obj.getObjGen()];
        min_end_offset = oc2.end_before_space;
        max_end_offset = oc2.end_after_space;
    } else {
        QTC::TC("qpdf", "QPDF hint table length direct");
    }
    qpdf_offset_t computed_end = offset + toO(length);
    if ((computed_end < min_end_offset) || (computed_end > max_end_offset)) {
        linearizationWarning(
            "expected = " + std::to_string(computed_end) +
            "; actual = " + std::to_string(min_end_offset) + ".." + std::to_string(max_end_offset));
        throw damagedPDF("linearization dictionary", "hint table length mismatch");
    }
    H.pipeStreamData(&pl, 0, qpdf_dl_specialized);
    return Hdict;
}